

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_consume(nghttp2_session *session,int32_t stream_id,size_t size)

{
  int iVar1;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream;
  int rv;
  size_t size_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (stream_id == 0) {
    session_local._4_4_ = -0x1f5;
  }
  else if ((session->opt_flags & 1) == 0) {
    session_local._4_4_ = -0x207;
  }
  else {
    session_local._4_4_ = session_update_connection_consumed_size(session,size);
    iVar1 = nghttp2_is_fatal(session_local._4_4_);
    if (iVar1 == 0) {
      stream_00 = nghttp2_session_get_stream(session,stream_id);
      if (stream_00 == (nghttp2_stream *)0x0) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = session_update_stream_consumed_size(session,stream_00,size);
        iVar1 = nghttp2_is_fatal(session_local._4_4_);
        if (iVar1 == 0) {
          session_local._4_4_ = 0;
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_consume(nghttp2_session *session, int32_t stream_id,
                            size_t size) {
  int rv;
  nghttp2_stream *stream;

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return 0;
  }

  rv = session_update_stream_consumed_size(session, stream, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}